

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O0

int disconnectclifromudpsrv(SOCKET sock)

{
  SOCKET sock_local;
  
  return 0;
}

Assistant:

inline int disconnectclifromudpsrv(SOCKET sock)
{

	// Should create another socket correctly bound in waitforcliudpsrv()...?

	UNREFERENCED_PARAMETER(sock);

	//// Shutdown the connection.
	//if (shutdown(sock, SD_BOTH) != EXIT_SUCCESS)
	//{
	//	PRINT_DEBUG_WARNING_OSNET(("disconnectclifromudpsrv warning (%s) : %s(sock=%d)\n",
	//		strtime_m(),
	//		"shutdown failed. ",
	//		(int)sock));
	//	//return EXIT_FAILURE;
	//}

	//// Destroy the socket created by socket().
	//if (closesocket(sock) != EXIT_SUCCESS)
	//{
	//	PRINT_DEBUG_ERROR_OSNET(("disconnectclifromudpsrv error (%s) : %s(sock=%d)\n",
	//		strtime_m(),
	//		"closesocket failed. ",
	//		(int)sock));
	//	return EXIT_FAILURE;
	//}

	return EXIT_SUCCESS;
}